

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

void rapidxml::xml_document<char>::insert_coded_character<0>(char **text,unsigned_long code)

{
  byte bVar1;
  parse_error *this;
  unsigned_long code_local;
  char **text_local;
  
  bVar1 = (byte)code;
  if (code < 0x80) {
    **text = bVar1;
    *text = *text + 1;
  }
  else if (code < 0x800) {
    (*text)[1] = bVar1 & 0xbf | 0x80;
    **text = (byte)(code >> 6) | 0xc0;
    *text = *text + 2;
  }
  else if (code < 0x10000) {
    (*text)[2] = bVar1 & 0xbf | 0x80;
    (*text)[1] = (byte)(code >> 6) & 0xbf | 0x80;
    **text = (byte)(code >> 0xc) | 0xe0;
    *text = *text + 3;
  }
  else {
    if (0x10ffff < code) {
      this = (parse_error *)__cxa_allocate_exception(0x18);
      parse_error::parse_error(this,"invalid numeric character entity",*text);
      __cxa_throw(this,&parse_error::typeinfo,parse_error::~parse_error);
    }
    (*text)[3] = bVar1 & 0xbf | 0x80;
    (*text)[2] = (byte)(code >> 6) & 0xbf | 0x80;
    (*text)[1] = (byte)(code >> 0xc) & 0xbf | 0x80;
    **text = (byte)(code >> 0x12) | 0xf0;
    *text = *text + 4;
  }
  return;
}

Assistant:

static void insert_coded_character(Ch *&text, unsigned long code)
        {
            if (Flags & parse_no_utf8)
            {
                // Insert 8-bit ASCII character
                // Todo: possibly verify that code is less than 256 and use replacement char otherwise?
                text[0] = static_cast<unsigned char>(code);
                text += 1;
            }
            else
            {
                // Insert UTF8 sequence
                if (code < 0x80)    // 1 byte sequence
                {
                    text[0] = static_cast<unsigned char>(code);
                    text += 1;
                }
                else if (code < 0x800)  // 2 byte sequence
                {
                    text[1] = static_cast<unsigned char>((code | 0x80) & 0xBF); code >>= 6;
                    text[0] = static_cast<unsigned char>(code | 0xC0);
                    text += 2;
                }
                else if (code < 0x10000)    // 3 byte sequence
                {
                    text[2] = static_cast<unsigned char>((code | 0x80) & 0xBF); code >>= 6;
                    text[1] = static_cast<unsigned char>((code | 0x80) & 0xBF); code >>= 6;
                    text[0] = static_cast<unsigned char>(code | 0xE0);
                    text += 3;
                }
                else if (code < 0x110000)   // 4 byte sequence
                {
                    text[3] = static_cast<unsigned char>((code | 0x80) & 0xBF); code >>= 6;
                    text[2] = static_cast<unsigned char>((code | 0x80) & 0xBF); code >>= 6;
                    text[1] = static_cast<unsigned char>((code | 0x80) & 0xBF); code >>= 6;
                    text[0] = static_cast<unsigned char>(code | 0xF0);
                    text += 4;
                }
                else    // Invalid, only codes up to 0x10FFFF are allowed in Unicode
                {
                    RAPIDXML_PARSE_ERROR("invalid numeric character entity", text);
                }
            }
        }